

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

void __thiscall aeron::archive::Configuration::Configuration(Configuration *this)

{
  bool bVar1;
  int32_t iVar2;
  type_info_t *ptVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  i_interpreter_type i_interpreter;
  size_type __dnew;
  ulong local_a0;
  undefined1 local_98 [8];
  type_info_t *local_90;
  type_info_t *local_88;
  undefined1 local_80;
  undefined1 local_7f;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  local_38 = (string *)&this->controlChannel;
  local_50 = &(this->controlChannel).field_2;
  (this->controlChannel)._M_dataplus._M_p = (pointer)local_50;
  (this->controlChannel)._M_string_length = 0;
  (this->controlChannel).field_2._M_local_buf[0] = '\0';
  local_40 = (string *)&this->localControlChannel;
  local_58 = &(this->localControlChannel).field_2;
  (this->localControlChannel)._M_dataplus._M_p = (pointer)local_58;
  (this->localControlChannel)._M_string_length = 0;
  (this->localControlChannel).field_2._M_local_buf[0] = '\0';
  local_48 = (string *)&this->controlResponseChannel;
  local_60 = &(this->controlResponseChannel).field_2;
  (this->controlResponseChannel)._M_dataplus._M_p = (pointer)local_60;
  (this->controlResponseChannel)._M_string_length = 0;
  (this->controlResponseChannel).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->recordingEventsChannel).field_2;
  (this->recordingEventsChannel)._M_dataplus._M_p = (pointer)local_68;
  (this->recordingEventsChannel)._M_string_length = 0;
  (this->recordingEventsChannel).field_2._M_local_buf[0] = '\0';
  ptVar3 = (type_info_t *)getenv("AERON_ARCHIVE_MESSAGE_TIMEOUT");
  if (ptVar3 == (type_info_t *)0x0) {
    uVar5 = 5000000000;
  }
  else {
    local_a0 = 0;
    local_88 = (type_info_t *)(local_98 + 4);
    local_90 = ptVar3;
    sVar4 = strlen((char *)ptVar3);
    local_88 = ptVar3 + sVar4;
    local_78.start = (char *)ptVar3;
    local_78.finish = (char *)local_88;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<long>(&local_78,(long *)&local_a0);
    uVar5 = local_a0;
    if (!bVar1) {
      local_98 = (undefined1  [8])&PTR__bad_cast_00162d30;
      local_90 = (type_info_t *)&char*::typeinfo;
      local_88 = (type_info_t *)&long::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_98);
    }
  }
  this->messageTimeoutNs = uVar5;
  pcVar6 = getenv("AERON_ARCHIVE_CONTROL_CHANNEL");
  local_98 = (undefined1  [8])&local_88;
  if (pcVar6 == (char *)0x0) {
    local_78.start = (char *)0x21;
    local_98 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_78);
    local_88 = (type_info_t *)local_78.start;
    *(undefined8 *)((long)local_98 + 0x10) = 0x6c61636f6c3d746e;
    *(undefined8 *)((long)local_98 + 0x18) = 0x3130383a74736f68;
    *(undefined8 *)local_98 = 0x64753a6e6f726561;
    *(undefined8 *)((long)local_98 + 8) = 0x696f70646e653f70;
    *(char *)((long)local_98 + 0x20) = '0';
    local_90 = (type_info_t *)local_78.start;
    *(type_info_t *)((long)local_98 + (long)local_78.start) = (type_info_t)0x0;
  }
  else {
    local_90 = (type_info_t *)0x0;
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffffffffff00);
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)0x0,(ulong)pcVar6);
  }
  std::__cxx11::string::operator=(local_38,(string *)local_98);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,(ulong)(local_88 + 1));
  }
  ptVar3 = (type_info_t *)getenv("AERON_ARCHIVE_CONTROL_STREAM_ID");
  if (ptVar3 == (type_info_t *)0x0) {
    iVar2 = 10;
  }
  else {
    local_a0 = local_a0 & 0xffffffff00000000;
    local_88 = (type_info_t *)(local_98 + 4);
    local_90 = ptVar3;
    sVar4 = strlen((char *)ptVar3);
    local_88 = ptVar3 + sVar4;
    local_78.start = (char *)ptVar3;
    local_78.finish = (char *)local_88;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_78,(int *)&local_a0);
    if (!bVar1) {
      local_98 = (undefined1  [8])&PTR__bad_cast_00162d30;
      local_90 = (type_info_t *)&char*::typeinfo;
      local_88 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_98);
    }
    iVar2 = (int32_t)local_a0;
  }
  this->controlStreamId = iVar2;
  pcVar6 = getenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL");
  if (pcVar6 == (char *)0x0) {
    local_88 = (type_info_t *)0x70693a6e6f726561;
    local_80 = 99;
    local_90 = (type_info_t *)0x9;
    local_7f = 0;
    local_98 = (undefined1  [8])&local_88;
  }
  else {
    local_90 = (type_info_t *)0x0;
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffffffffff00);
    local_98 = (undefined1  [8])&local_88;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)0x0,(ulong)pcVar6);
  }
  std::__cxx11::string::operator=(local_40,(string *)local_98);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,(ulong)(local_88 + 1));
  }
  ptVar3 = (type_info_t *)getenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID");
  if (ptVar3 == (type_info_t *)0x0) {
    iVar2 = 0xb;
  }
  else {
    local_a0 = local_a0 & 0xffffffff00000000;
    local_88 = (type_info_t *)(local_98 + 4);
    local_90 = ptVar3;
    sVar4 = strlen((char *)ptVar3);
    local_88 = ptVar3 + sVar4;
    local_78.start = (char *)ptVar3;
    local_78.finish = (char *)local_88;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_78,(int *)&local_a0);
    if (!bVar1) {
      local_98 = (undefined1  [8])&PTR__bad_cast_00162d30;
      local_90 = (type_info_t *)&char*::typeinfo;
      local_88 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_98);
    }
    iVar2 = (int32_t)local_a0;
  }
  this->localControlStreamId = iVar2;
  pcVar6 = getenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL");
  if (pcVar6 == (char *)0x0) {
    local_78.start = (char *)0x21;
    local_98 = (undefined1  [8])&local_88;
    local_98 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_78);
    local_88 = (type_info_t *)local_78.start;
    *(undefined8 *)((long)local_98 + 0x10) = 0x6c61636f6c3d746e;
    *(undefined8 *)((long)local_98 + 0x18) = 0x3230383a74736f68;
    *(undefined8 *)local_98 = 0x64753a6e6f726561;
    *(undefined8 *)((long)local_98 + 8) = 0x696f70646e653f70;
    *(char *)((long)local_98 + 0x20) = '0';
    local_90 = (type_info_t *)local_78.start;
    *(type_info_t *)((long)local_98 + (long)local_78.start) = (type_info_t)0x0;
  }
  else {
    local_90 = (type_info_t *)0x0;
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffffffffff00);
    local_98 = (undefined1  [8])&local_88;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)0x0,(ulong)pcVar6);
  }
  std::__cxx11::string::operator=(local_48,(string *)local_98);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,(ulong)(local_88 + 1));
  }
  ptVar3 = (type_info_t *)getenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID");
  if (ptVar3 == (type_info_t *)0x0) {
    iVar2 = 0x14;
  }
  else {
    local_a0 = local_a0 & 0xffffffff00000000;
    local_88 = (type_info_t *)(local_98 + 4);
    local_90 = ptVar3;
    sVar4 = strlen((char *)ptVar3);
    local_88 = ptVar3 + sVar4;
    local_78.start = (char *)ptVar3;
    local_78.finish = (char *)local_88;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_78,(int *)&local_a0);
    if (!bVar1) {
      local_98 = (undefined1  [8])&PTR__bad_cast_00162d30;
      local_90 = (type_info_t *)&char*::typeinfo;
      local_88 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_98);
    }
    iVar2 = (int32_t)local_a0;
  }
  this->controlResponseStreamId = iVar2;
  pcVar6 = getenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL");
  if (pcVar6 == (char *)0x0) {
    local_78.start = (char *)0x21;
    local_98 = (undefined1  [8])&local_88;
    local_98 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_78);
    local_88 = (type_info_t *)local_78.start;
    *(undefined8 *)((long)local_98 + 0x10) = 0x6c61636f6c3d746e;
    *(undefined8 *)((long)local_98 + 0x18) = 0x3330383a74736f68;
    *(undefined8 *)local_98 = 0x64753a6e6f726561;
    *(undefined8 *)((long)local_98 + 8) = 0x696f70646e653f70;
    *(char *)((long)local_98 + 0x20) = '0';
    local_90 = (type_info_t *)local_78.start;
    *(type_info_t *)((long)local_98 + (long)local_78.start) = (type_info_t)0x0;
  }
  else {
    local_90 = (type_info_t *)0x0;
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffffffffff00);
    local_98 = (undefined1  [8])&local_88;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)0x0,(ulong)pcVar6);
  }
  std::__cxx11::string::operator=((string *)&this->recordingEventsChannel,(string *)local_98);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,(ulong)(local_88 + 1));
  }
  ptVar3 = (type_info_t *)getenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID");
  if (ptVar3 == (type_info_t *)0x0) {
    iVar2 = 0x1e;
  }
  else {
    local_a0 = local_a0 & 0xffffffff00000000;
    local_88 = (type_info_t *)(local_98 + 4);
    local_90 = ptVar3;
    sVar4 = strlen((char *)ptVar3);
    local_88 = ptVar3 + sVar4;
    local_78.start = (char *)ptVar3;
    local_78.finish = (char *)local_88;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_78,(int *)&local_a0);
    if (!bVar1) {
      local_98 = (undefined1  [8])&PTR__bad_cast_00162d30;
      local_90 = (type_info_t *)&char*::typeinfo;
      local_88 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_98);
    }
    iVar2 = (int32_t)local_a0;
  }
  this->recordingEventsStreamId = iVar2;
  ptVar3 = (type_info_t *)getenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE");
  if (ptVar3 == (type_info_t *)0x0) {
    bVar1 = true;
  }
  else {
    local_a0 = local_a0 & 0xffffffffffffff00;
    local_88 = (type_info_t *)(local_98 + 4);
    local_90 = ptVar3;
    sVar4 = strlen((char *)ptVar3);
    local_88 = ptVar3 + sVar4;
    local_78.start = (char *)ptVar3;
    local_78.finish = (char *)local_88;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::operator>>
                      (&local_78,(bool *)&local_a0);
    if (!bVar1) {
      local_98 = (undefined1  [8])&PTR__bad_cast_00162d30;
      local_90 = (type_info_t *)&char*::typeinfo;
      local_88 = (type_info_t *)&bool::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_98);
    }
    bVar1 = local_a0._0_1_;
  }
  this->controlTermBufferSparse = bVar1;
  ptVar3 = (type_info_t *)getenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH");
  if (ptVar3 == (type_info_t *)0x0) {
    iVar2 = 0x10000;
  }
  else {
    local_a0 = local_a0 & 0xffffffff00000000;
    local_88 = (type_info_t *)(local_98 + 4);
    local_90 = ptVar3;
    sVar4 = strlen((char *)ptVar3);
    local_88 = ptVar3 + sVar4;
    local_78.start = (char *)ptVar3;
    local_78.finish = (char *)local_88;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_78,(int *)&local_a0);
    if (!bVar1) {
      local_98 = (undefined1  [8])&PTR__bad_cast_00162d30;
      local_90 = (type_info_t *)&char*::typeinfo;
      local_88 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_98);
    }
    iVar2 = (int32_t)local_a0;
  }
  this->controlTermBufferLength = iVar2;
  ptVar3 = (type_info_t *)getenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH");
  if (ptVar3 == (type_info_t *)0x0) {
    local_a0._0_4_ = 0x580;
  }
  else {
    local_a0 = local_a0 & 0xffffffff00000000;
    local_88 = (type_info_t *)(local_98 + 4);
    local_90 = ptVar3;
    sVar4 = strlen((char *)ptVar3);
    local_88 = ptVar3 + sVar4;
    local_78.start = (char *)ptVar3;
    local_78.finish = (char *)local_88;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_78,(int *)&local_a0);
    if (!bVar1) {
      local_98 = (undefined1  [8])&PTR__bad_cast_00162d30;
      local_90 = (type_info_t *)&char*::typeinfo;
      local_88 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_98);
    }
  }
  this->controlMtuLength = (int32_t)local_a0;
  return;
}

Assistant:

Configuration::Configuration() {
    messageTimeoutNs = getMessageTimeout();
    controlChannel = getControlChannel();
    controlStreamId = getControlStreamId();
    localControlChannel = getLocalControlChannel();
    localControlStreamId = getLocalControlStreamId();
    controlResponseChannel = getControlResponseChannel();
    controlResponseStreamId = getControlResponseStreamId();
    recordingEventsChannel = getRecordingEventsChannel();
    recordingEventsStreamId = getRecordingEventsStreamId();
    controlTermBufferSparse = getControlTermBufferSparse();
    controlTermBufferLength = getControlTermBufferLength();
    controlMtuLength = getControlMtuLength();
}